

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockd.h
# Opt level: O0

int av1_allow_palette(int allow_screen_content_tools,BLOCK_SIZE sb_type)

{
  bool local_6;
  BLOCK_SIZE sb_type_local;
  int allow_screen_content_tools_local;
  
  local_6 = false;
  if (((allow_screen_content_tools != 0) && (local_6 = false, block_size_wide[sb_type] < 0x41)) &&
     (local_6 = false, block_size_high[sb_type] < 0x41)) {
    local_6 = BLOCK_8X4 < sb_type;
  }
  return (int)local_6;
}

Assistant:

static inline int av1_allow_palette(int allow_screen_content_tools,
                                    BLOCK_SIZE sb_type) {
  assert(sb_type < BLOCK_SIZES_ALL);
  return allow_screen_content_tools &&
         block_size_wide[sb_type] <= MAX_PALETTE_BLOCK_WIDTH &&
         block_size_high[sb_type] <= MAX_PALETTE_BLOCK_HEIGHT &&
         sb_type >= BLOCK_8X8;
}